

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::dumpKernelISABinaries(CLIntercept *this,cl_program program)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  cl_uint cVar4;
  cl_uint k;
  int iVar5;
  cl_int cVar6;
  cl_kernel *pp_Var7;
  ulong uVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  cl_uint k_1;
  cl_kernel kernel;
  ulong uVar11;
  bool bVar12;
  double __x;
  cl_uint numKernels;
  cl_device_type deviceType;
  cl_uint numDevices;
  pthread_mutex_t *local_1f0;
  char *local_1e8;
  cl_kernel local_1e0;
  char *local_1d8;
  cl_device_id *local_1d0;
  cl_program program_local;
  cl_kernel *local_1c0;
  cl_device_id *local_1b8;
  size_t kernelISABinarySize;
  char *local_1a8;
  ulong local_1a0;
  string fileNamePrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char numberString [256];
  
  local_1f0 = (pthread_mutex_t *)&this->m_Mutex;
  program_local = program;
  std::mutex::lock((mutex *)&local_1f0->__data);
  numKernels = 0;
  iVar5 = (*(this->m_Dispatch).clCreateKernelsInProgram)(program,0,(cl_kernel *)0x0,&numKernels);
  cVar4 = numKernels;
  if (numKernels == 0 || iVar5 != 0) {
    pp_Var7 = (cl_kernel *)0x0;
  }
  else {
    uVar11 = (ulong)numKernels;
    pp_Var7 = (cl_kernel *)operator_new__(uVar11 * 8);
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      pp_Var7[uVar8] = (cl_kernel)0x0;
    }
    iVar5 = (*(this->m_Dispatch).clCreateKernelsInProgram)(program,cVar4,pp_Var7,(cl_uint *)0x0);
    program = program_local;
  }
  numDevices = 0;
  local_1d0 = (cl_device_id *)0x0;
  if (iVar5 == 0) {
    cVar6 = allocateAndGetProgramDeviceList(this,program,&numDevices,&local_1d0);
    bVar12 = cVar6 == 0;
    program = program_local;
  }
  else {
    bVar12 = false;
  }
  if (((pp_Var7 != (cl_kernel *)0x0) && (bVar12)) && (program != (cl_program)0x0)) {
    pmVar9 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&program_local);
    fileNamePrefix._M_dataplus._M_p = (pointer)&fileNamePrefix.field_2;
    fileNamePrefix._M_string_length = 0;
    fileNamePrefix.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string
              ((string *)numberString,sc_DumpDirectoryName,(allocator *)&local_178);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,(string *)numberString,&fileNamePrefix);
    std::__cxx11::string::~string((string *)numberString);
    memset(numberString,0,0x100);
    if ((this->m_Config).OmitProgramNumber == true) {
      uVar1 = pmVar9->CompileCount;
      uVar2 = (uint)pmVar9->ProgramHash;
      uVar3 = (uint)pmVar9->OptionsHash;
      pcVar10 = "%08X_%04u_%08X_";
    }
    else {
      uVar1 = (uint)pmVar9->ProgramHash;
      uVar2 = pmVar9->ProgramNumber;
      uVar3 = pmVar9->CompileCount;
      pcVar10 = "%04u_%08X_%04u_%08X_";
    }
    snprintf(numberString,0x100,pcVar10,(ulong)uVar2,(ulong)uVar1,(ulong)uVar3);
    std::__cxx11::string::append((char *)&fileNamePrefix);
    std::__cxx11::string::append((char *)&fileNamePrefix);
    local_1c0 = pp_Var7;
    OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&fileNamePrefix);
    local_1b8 = local_1d0;
    cVar6 = 0;
    uVar8 = 0;
    while (uVar8 < numKernels) {
      local_1e0 = local_1c0[uVar8];
      local_1a8 = (char *)0x0;
      local_1a0 = uVar8;
      if (cVar6 == 0) {
        cVar6 = allocateAndGetKernelInfoString(this,local_1e0,0x1190,&local_1a8);
      }
      kernel = local_1e0;
      local_1e8 = local_1a8;
      for (uVar8 = 0; uVar8 < numDevices; uVar8 = uVar8 + 1) {
        kernelISABinarySize = 0;
        local_1d8 = (char *)0x0;
        if (cVar6 == 0) {
          cVar6 = allocateAndGetKernelISABinary
                            (this,kernel,local_1b8[uVar8],&kernelISABinarySize,&local_1d8);
          pcVar10 = local_1d8;
          if (cVar6 == 0) {
            std::__cxx11::string::string((string *)numberString,(string *)&fileNamePrefix);
            deviceType = 1;
            (*(this->m_Dispatch).clGetDeviceInfo)
                      (local_1b8[uVar8],0x1000,8,&deviceType,(size_t *)0x0);
            if ((deviceType & 2) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 4) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 8) != 0) {
              std::__cxx11::string::append(numberString);
            }
            if ((deviceType & 0x10) != 0) {
              std::__cxx11::string::append(numberString);
            }
            std::__cxx11::string::append(numberString);
            std::__cxx11::string::append(numberString);
            std::operator+(&local_158,"Dumping kernel ISA binary to file: ",(string *)numberString);
            std::operator+(&local_178,&local_158,"\n");
            log(this,__x);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_158);
            pcVar10 = local_1d8;
            dumpMemoryToFile(this,(string *)numberString,false,local_1d8,kernelISABinarySize);
            std::__cxx11::string::~string((string *)numberString);
          }
          kernel = local_1e0;
          if (pcVar10 != (char *)0x0) {
            operator_delete__(pcVar10);
            kernel = local_1e0;
          }
        }
      }
      if (local_1e8 != (char *)0x0) {
        operator_delete__(local_1e8);
      }
      uVar8 = local_1a0 + 1;
    }
    std::__cxx11::string::~string((string *)&fileNamePrefix);
    pp_Var7 = local_1c0;
  }
  if (pp_Var7 != (cl_kernel *)0x0) {
    for (uVar8 = 0; uVar8 < numKernels; uVar8 = uVar8 + 1) {
      if (pp_Var7[uVar8] != (cl_kernel)0x0) {
        (*(this->m_Dispatch).clReleaseKernel)();
        pp_Var7[uVar8] = (cl_kernel)0x0;
      }
    }
    operator_delete__(pp_Var7);
  }
  if (local_1d0 != (cl_device_id *)0x0) {
    operator_delete__(local_1d0);
  }
  pthread_mutex_unlock(local_1f0);
  return;
}

Assistant:

void CLIntercept::dumpKernelISABinaries(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    // Since the kernel ISA binaries are retrieved via kernel queries, the first
    // thing we need to do is to create the kernels for this program.

    cl_uint numKernels = 0;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clCreateKernelsInProgram(
            program,
            0,
            NULL,
            &numKernels );
    }
    cl_kernel*  kernels = NULL;
    if( errorCode == CL_SUCCESS && numKernels != 0 )
    {
        kernels = new cl_kernel[ numKernels ];
        if( kernels )
        {
            for( cl_uint k = 0; k < numKernels; k++ )
            {
                kernels[k] = NULL;
            }
            errorCode = dispatch().clCreateKernelsInProgram(
                program,
                numKernels,
                kernels,
                NULL );
        }
        else
        {
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    // Also, get the list of devices for the program.
    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS && program != NULL && kernels != NULL )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        std::string fileNamePrefix;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileNamePrefix );
        }
        // Make the file name prefix.  It will have the form:
        //   CLI_<program number>_<program hash>_<compile count>_<options hash>_<device type>_<kernel name>.isabin
        // We'll fill in the device type and kernel name later.
        {
            char    numberString[256] = "";

            if( config().OmitProgramNumber )
            {
                CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X_",
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }
            else
            {
                CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X_",
                    programInfo.ProgramNumber,
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }

            fileNamePrefix += "/CLI_";
            fileNamePrefix += numberString;
        }
        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileNamePrefix );
        }

        for( cl_uint k = 0; k < numKernels; k++ )
        {
            cl_kernel   kernel = kernels[ k ];

            // Get the kernel name.  We can't use the kernel name map yet, so
            // use a kernel query instead.
            char* kernelName = NULL;
            if( errorCode == CL_SUCCESS )
            {
                errorCode = allocateAndGetKernelInfoString(
                    kernel,
                    CL_KERNEL_FUNCTION_NAME,
                    kernelName );
            }

            for( cl_uint d = 0; d < numDevices; d++ )
            {
                size_t      kernelISABinarySize = 0;
                char*       kernelISABinary = NULL;

                if( errorCode == CL_SUCCESS )
                {
                    errorCode = allocateAndGetKernelISABinary(
                        kernel,
                        deviceList[d],
                        kernelISABinarySize,
                        kernelISABinary );
                }

                if( errorCode == CL_SUCCESS )
                {
                    std::string fileName( fileNamePrefix );

                    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                    // It's OK if this fails.  If it does, it just
                    // means that our output file won't have a device
                    // type.
                    dispatch().clGetDeviceInfo(
                        deviceList[d],
                        CL_DEVICE_TYPE,
                        sizeof( deviceType ),
                        &deviceType,
                        NULL );

                    if( deviceType & CL_DEVICE_TYPE_CPU )
                    {
                        fileName += "CPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_GPU )
                    {
                        fileName += "GPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                    {
                        fileName += "ACC_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                    {
                        fileName+= "CUSTOM_";
                    }

                    fileName += kernelName;
                    fileName += ".isabin";

                    log( "Dumping kernel ISA binary to file: " + fileName + "\n" );
                    dumpMemoryToFile(
                        fileName,
                        false,
                        kernelISABinary,
                        kernelISABinarySize );
                }

                delete [] kernelISABinary;
                kernelISABinary = NULL;
            }

            delete [] kernelName;
            kernelName = NULL;
        }
    }

    // If we have kernels, release them.
    if( kernels )
    {
        for( cl_uint k = 0; k < numKernels; k++ )
        {
            if( kernels[k] )
            {
                dispatch().clReleaseKernel( kernels[k] );
                kernels[k] = NULL;
            }
        }
    }

    delete [] kernels;
    kernels = NULL;

    delete [] deviceList;
    deviceList = NULL;
}